

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

bool Image_Function::IsBinary
               (Image *image,uint32_t startX,uint32_t startY,uint32_t width,uint32_t height)

{
  bool bVar1;
  const_iterator this;
  reference puVar2;
  byte bVar3;
  const_iterator value;
  size_t counter;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffc0;
  Image *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc8,
             (uint32_t)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc0._M_current);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)in_stack_ffffffffffffffc0._M_current);
  Histogram(in_stack_ffffffffffffffc8,
            (uint32_t)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20),
            (uint32_t)in_stack_ffffffffffffffc0._M_current,
            (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(uint32_t)in_stack_ffffffffffffffb8
           );
  uVar4 = 0;
  this = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&stack0xffffffffffffffc0);
    if (*puVar2 != 0) {
      uVar4 = uVar4 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  bVar3 = uVar4 < 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this._M_current);
  return (bool)(bVar3 & 1);
}

Assistant:

bool IsBinary( const Image & image, uint32_t startX, uint32_t startY, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, startX, startY, width, height );
        VerifyGrayScaleImage( image );

        const std::vector< uint32_t > histogram = Histogram( image, startX, startY, width, height );

        size_t counter = 0u;

        for( std::vector< uint32_t >::const_iterator value = histogram.begin(); value != histogram.end(); ++value ) {
            if( (*value) > 0u )
                ++counter;
        }

        return (counter < 3u);
    }